

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_impl.cpp
# Opt level: O0

MPP_RET __thiscall
RcImplApiService::api_get_by_type
          (RcImplApiService *this,RcApiBrief *brief,RK_S32 *count,RK_S32 max_count,
          MppCodingType type)

{
  undefined4 uVar1;
  Mutex *mutex;
  RcApiBrief *pRVar2;
  undefined1 local_50 [8];
  AutoMutex auto_lock;
  RcImplApiNode *n;
  RcImplApiNode *pos;
  RK_S32 cnt;
  MppCodingType type_local;
  RK_S32 max_count_local;
  RK_S32 *count_local;
  RcApiBrief *brief_local;
  RcImplApiService *this_local;
  
  pos._4_4_ = 0;
  mutex = get_lock();
  Mutex::Autolock::Autolock((Autolock *)local_50,mutex,1);
  n = (RcImplApiNode *)(this->mApis).next;
  auto_lock.mLock = (Mutex *)(n->list).next;
  while ((n != (RcImplApiNode *)&this->mApis && (pos._4_4_ < max_count))) {
    if (n->type == type) {
      pRVar2 = brief + pos._4_4_;
      pRVar2->name = (n->brief).name;
      uVar1 = *(undefined4 *)&(n->brief).field_0xc;
      pRVar2->type = (n->brief).type;
      *(undefined4 *)&pRVar2->field_0xc = uVar1;
      pos._4_4_ = pos._4_4_ + 1;
    }
    n = (RcImplApiNode *)auto_lock.mLock;
    auto_lock.mLock = (Mutex *)((auto_lock.mLock)->mMutex).__align;
  }
  *count = pos._4_4_;
  Mutex::Autolock::~Autolock((Autolock *)local_50);
  return MPP_OK;
}

Assistant:

MPP_RET RcImplApiService::api_get_by_type(RcApiBrief *brief, RK_S32 *count,
                                          RK_S32 max_count, MppCodingType type)
{
    RK_S32 cnt = 0;
    RcImplApiNode *pos, *n;

    AutoMutex auto_lock(get_lock());

    list_for_each_entry_safe(pos, n, &mApis, RcImplApiNode, list) {
        if (cnt >= max_count)
            break;

        if (pos->type != type)
            continue;

        brief[cnt++] = pos->brief;
    }

    *count = cnt;

    return MPP_OK;
}